

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalysis.cpp
# Opt level: O2

LexicalScoping __thiscall
luna::SemanticAnalysisVisitor::SearchName(SemanticAnalysisVisitor *this,String *str)

{
  iterator iVar1;
  LexicalFunction *pLVar2;
  LexicalBlock *pLVar3;
  String *str_local;
  
  pLVar2 = this->current_function_;
  str_local = str;
  if ((pLVar2 != (LexicalFunction *)0x0) && (pLVar2->current_block_ != (LexicalBlock *)0x0)) {
    do {
      if (pLVar2 == (LexicalFunction *)0x0) {
        return LexicalScoping_Global;
      }
      pLVar3 = (LexicalBlock *)&pLVar2->current_block_;
      while (pLVar3 = pLVar3->parent_, pLVar3 != (LexicalBlock *)0x0) {
        iVar1 = std::
                _Hashtable<const_luna::String_*,_const_luna::String_*,_std::allocator<const_luna::String_*>,_std::__detail::_Identity,_std::equal_to<const_luna::String_*>,_std::hash<const_luna::String_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::find(&(pLVar3->names_)._M_h,&str_local);
        if (iVar1.super__Node_iterator_base<const_luna::String_*,_false>._M_cur !=
            (__node_type *)0x0) {
          return pLVar2 == this->current_function_ | LexicalScoping_Upvalue;
        }
      }
      pLVar2 = pLVar2->parent_;
    } while( true );
  }
  __assert_fail("current_function_ && current_function_->current_block_",
                "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/SemanticAnalysis.cpp"
                ,0x80,
                "LexicalScoping luna::SemanticAnalysisVisitor::SearchName(const String *) const");
}

Assistant:

LexicalScoping SearchName(const String *str) const
        {
            assert(current_function_ && current_function_->current_block_);

            auto function = current_function_;
            while (function)
            {
                auto block = function->current_block_;
                while (block)
                {
                    auto it = block->names_.find(str);
                    if (it != block->names_.end())
                    {
                        return function == current_function_ ?
                            LexicalScoping_Local : LexicalScoping_Upvalue;
                    }

                    block = block->parent_;
                }

                function = function->parent_;
            }

            return LexicalScoping_Global;
        }